

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O3

void __thiscall axl::io::MappedFile::attach(MappedFile *this,Handle fileHandle,uint_t flags)

{
  int __fd;
  
  close(this,fileHandle);
  __fd = (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
         m_h;
  if (__fd != -1) {
    ::close(__fd);
  }
  (this->m_file).m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       fileHandle;
  this->m_fileFlags = flags;
  return;
}

Assistant:

void
MappedFile::attach(
	File::Handle fileHandle,
	uint_t flags
) {
	close();

	m_file.m_file.attach(fileHandle);
	m_fileFlags = flags;
}